

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

int ON_wString::FormatVargsIntoBuffer(ON_wStringBuffer *buffer,wchar_t *format,__va_list_tag *args)

{
  wchar_t *buffer_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  va_list args_copy;
  
  args_copy[0].reg_save_area = args->reg_save_area;
  args_copy[0].gp_offset = args->gp_offset;
  args_copy[0].fp_offset = args->fp_offset;
  args_copy[0].overflow_arg_area = args->overflow_arg_area;
  uVar2 = FormatVargsOutputCount(format,args_copy);
  sVar4 = 1;
  if (0 < (int)uVar2) {
    sVar4 = (ulong)uVar2 + 1;
  }
  bVar1 = ON_wStringBuffer::GrowBuffer(buffer,sVar4);
  if (((bVar1) && (buffer_00 = buffer->m_buffer, buffer_00 != (wchar_t *)0x0)) &&
     (sVar4 = buffer->m_buffer_capacity, sVar4 != 0)) {
    *buffer_00 = L'\0';
    buffer_00[sVar4 - 1] = L'\0';
    uVar3 = uVar2;
    if (0 < (int)uVar2) {
      uVar3 = FormatVargsIntoBuffer(buffer_00,sVar4,format,args);
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((int)uVar2 < -1) {
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

int ON_wString::FormatVargsIntoBuffer(
  ON_wStringBuffer& buffer,
  const wchar_t* format,
  va_list args
  )
{
  va_list args_copy;
  va_copy(args_copy, args);
  int rc = ON_wString::FormatVargsOutputCount(format, args_copy);
  va_end(args_copy);

  size_t buffer_capacity = (rc <= 0) ? 1 : (size_t(rc) + 1);
  if (false == buffer.GrowBuffer(buffer_capacity) || nullptr == buffer.m_buffer || buffer.m_buffer_capacity <= 0)
    return (rc < 0 ? rc : -1);

  buffer.m_buffer[0] = 0;
  buffer.m_buffer[buffer.m_buffer_capacity - 1] = 0;
  if (rc > 0)
  {
    rc = ON_wString::FormatVargsIntoBuffer(buffer.m_buffer, buffer.m_buffer_capacity, format, args);
  }
  return rc;
}